

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
insert<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr&>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,size_t pos,char (*params) [7])

{
  long lVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  char *__s1;
  undefined8 *in_R9;
  ulong uVar5;
  ulong uVar6;
  Maybe<unsigned_long> MVar7;
  Iterator iter;
  Iterator local_70;
  size_t local_58;
  size_t local_50;
  SearchKey local_48;
  StringPtr *local_40;
  size_t *local_38;
  
  local_58 = table.size_;
  local_40 = table.ptr;
  local_38 = &local_58;
  local_48._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00237348;
  local_50 = pos;
  _::BTreeImpl::insert(&local_70,(BTreeImpl *)&(local_40->content).size_,&local_48);
  uVar5 = (ulong)local_70.row;
  if ((uVar5 != 0xe) && ((local_70.leaf)->rows[uVar5].i != 0)) {
    uVar6 = (ulong)((local_70.leaf)->rows[uVar5].i - 1);
    lVar3 = uVar6 * 0x20;
    lVar1 = *(long *)(local_58 + 8 + lVar3);
    __n = lVar1 + (ulong)(lVar1 == 0);
    if (__n == in_R9[1]) {
      if (lVar1 == 0) {
        __s1 = "";
      }
      else {
        __s1 = *(char **)(local_58 + lVar3);
      }
      iVar2 = bcmp(__s1,(void *)*in_R9,__n);
      if (iVar2 == 0) {
        *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x1;
        *(ulong *)(this + 8) = uVar6;
        aVar4 = extraout_RDX;
        goto LAB_001825e9;
      }
    }
  }
  memmove((local_70.leaf)->rows + uVar5 + 1,(local_70.leaf)->rows + uVar5,
          (ulong)(local_70.row + 1) * -4 + 0x38);
  (local_70.leaf)->rows[uVar5].i = (int)params + 1;
  *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x0;
  aVar4 = extraout_RDX_00;
LAB_001825e9:
  MVar7.ptr.field_1.value = aVar4.value;
  MVar7.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar7.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }